

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadhb.c
# Opt level: O1

void sreadhb(FILE *fp,int *nrow,int *ncol,int_t *nonz,float **nzval,int_t **rowind,int_t **colptr)

{
  long lVar1;
  float fVar2;
  int_t *addr;
  int_t *piVar3;
  int_t *__s;
  int_t *addr_00;
  int_t *addr_01;
  void *addr_02;
  long lVar4;
  ulong uVar5;
  int_t *piVar6;
  float *pfVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int tmp;
  int valsize;
  int valnum;
  int rowsize;
  int rownum;
  int colsize;
  int colnum;
  char type [4];
  char buf [100];
  char msg [256];
  int local_20c;
  int_t *local_208;
  float **local_200;
  int_t **local_1f8;
  float *local_1f0;
  int_t *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  undefined1 local_1c4;
  byte local_1c3;
  undefined1 local_1c1;
  int_t *local_1c0;
  long local_1b8;
  FILE *local_1b0;
  char local_1a8 [14];
  undefined1 local_19a;
  char local_138 [264];
  
  local_208 = nonz;
  local_200 = nzval;
  local_1f8 = rowind;
  fgets(local_1a8,100,(FILE *)fp);
  fputs(local_1a8,_stdout);
  iVar12 = 5;
  iVar13 = 0;
  iVar9 = 0;
  do {
    __isoc99_fscanf(fp,"%14c",local_1a8);
    local_19a = 0;
    __isoc99_sscanf(local_1a8,"%d",&local_20c);
    if (iVar12 == 2) {
      iVar9 = local_20c;
    }
    iVar14 = local_20c;
    if (local_20c == 0) {
      iVar14 = iVar13;
    }
    if (iVar12 != 1) {
      iVar14 = iVar13;
    }
    iVar13 = iVar14;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  __isoc99_fscanf(fp,"%3c",&local_1c4);
  __isoc99_fscanf(fp,"%11c",local_1a8);
  local_1c1 = 0;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *nrow = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  *ncol = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  iVar12 = atoi(local_1a8);
  piVar6 = local_208;
  *local_208 = iVar12;
  __isoc99_fscanf(fp,"%14c",local_1a8);
  local_20c = atoi(local_1a8);
  if (local_20c != 0) {
    puts("This is not an assembled matrix!");
  }
  if (*nrow != *ncol) {
    puts("Matrix is not square.");
  }
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  sallocateA(*ncol,*piVar6,local_200,local_1f8,colptr);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  sParseIntFormat(local_1a8,&local_1c8,&local_1cc);
  __isoc99_fscanf(fp,"%16c",local_1a8);
  sParseIntFormat(local_1a8,&local_1d0,&local_1d4);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  sParseFloatFormat(local_1a8,&local_1d8,&local_1dc);
  __isoc99_fscanf(fp,"%20c",local_1a8);
  do {
    iVar12 = fgetc((FILE *)fp);
  } while (iVar12 != 10);
  if (iVar13 != 0) {
    do {
      iVar12 = fgetc((FILE *)fp);
    } while (iVar12 != 10);
  }
  ReadVector(fp,*ncol + 1,*colptr,local_1c8,local_1cc);
  ReadVector(fp,*piVar6,*local_1f8,local_1d0,local_1d4);
  if (iVar9 != 0) {
    sReadValues(fp,*piVar6,*local_200,local_1d8,local_1dc);
  }
  if ((local_1c3 & 0xdf) != 0x53) goto LAB_00104d8a;
  uVar15 = *ncol;
  uVar8 = (ulong)uVar15;
  piVar6 = *local_1f8;
  addr = *colptr;
  pfVar7 = *local_200;
  iVar9 = uVar15 + 1;
  __s = intMalloc(iVar9);
  if (__s == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xcb,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  addr_00 = intMalloc(iVar9);
  if (addr_00 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xcd,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  piVar3 = local_208;
  addr_01 = intMalloc(*local_208);
  local_1f0 = pfVar7;
  if (addr_01 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xcf,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadhb.c");
    pfVar7 = local_1f0;
    superlu_abort_and_exit(local_138);
  }
  addr_02 = superlu_malloc((long)*piVar3 << 2);
  if (addr_02 == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_val[]",0xd1,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadhb.c");
    pfVar7 = local_1f0;
    superlu_abort_and_exit(local_138);
  }
  if ((int)uVar15 < 1) {
    *addr_00 = 0;
LAB_00104a55:
    if (0 < (int)uVar15) {
      uVar5 = 0;
      do {
        lVar4 = (long)addr[uVar5];
        uVar10 = uVar5 + 1;
        if (addr[uVar5] < addr[uVar5 + 1]) {
          do {
            iVar12 = piVar6[lVar4];
            addr_01[__s[iVar12]] = (int_t)uVar5;
            iVar13 = __s[iVar12];
            *(float *)((long)addr_02 + (long)iVar13 * 4) = pfVar7[lVar4];
            __s[iVar12] = iVar13 + 1;
            lVar4 = lVar4 + 1;
          } while (lVar4 < addr[uVar10]);
        }
        uVar5 = uVar10;
      } while (uVar10 != uVar8);
    }
  }
  else {
    memset(__s,0,uVar8 * 4);
    uVar5 = 0;
    do {
      lVar4 = (long)addr[uVar5];
      uVar10 = uVar5 + 1;
      if (addr[uVar5] < addr[uVar5 + 1]) {
        do {
          __s[piVar6[lVar4]] = __s[piVar6[lVar4]] + 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 < addr[uVar10]);
      }
      uVar5 = uVar10;
    } while (uVar10 != uVar8);
    *addr_00 = 0;
    if (0 < (int)uVar15) {
      uVar5 = 0;
      do {
        addr_00[uVar5 + 1] = __s[uVar5] + addr_00[uVar5];
        __s[uVar5] = addr_00[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      goto LAB_00104a55;
    }
  }
  lVar4 = (long)*local_208 * 2 - (long)(int)uVar15;
  local_1e8 = intMalloc(iVar9);
  if (local_1e8 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC a_colptr[]",0xea,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_1c0 = piVar6;
  local_1b0 = (FILE *)fp;
  piVar6 = intMalloc((int_t)lVar4);
  if (piVar6 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_rowind[]",0xec,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  local_1b8 = lVar4;
  pfVar7 = (float *)superlu_malloc(lVar4 * 4);
  if (pfVar7 == (float *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for a_val[]",0xee,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sreadhb.c");
    superlu_abort_and_exit(local_138);
  }
  *local_1e8 = 0;
  if (0 < (int)uVar15) {
    uVar15 = 0;
    uVar5 = 0;
    do {
      lVar4 = (long)addr_00[uVar5];
      uVar10 = uVar5 + 1;
      if (addr_00[uVar5] < addr_00[uVar5 + 1]) {
        do {
          if (uVar5 != (uint)addr_01[lVar4]) {
            piVar6[(int)uVar15] = addr_01[lVar4];
            fVar2 = *(float *)((long)addr_02 + lVar4 * 4);
            pfVar7[(int)uVar15] = fVar2;
            if (ABS(fVar2) <= 0.0 && ABS(fVar2) != 0.0) {
              printf("%5d: %e\n",(ulong)uVar15);
            }
            uVar15 = uVar15 + 1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < addr_00[uVar10]);
      }
      lVar4 = (long)addr[uVar5];
      if (addr[uVar5] < addr[uVar10]) {
        lVar11 = 0;
        do {
          piVar6[(int)uVar15 + lVar11] = local_1c0[lVar4 + lVar11];
          pfVar7[(int)uVar15 + lVar11] = local_1f0[lVar4 + lVar11];
          lVar1 = lVar4 + lVar11;
          lVar11 = lVar11 + 1;
        } while (lVar1 + 1 < (long)addr[uVar10]);
        uVar15 = uVar15 + (int)lVar11;
      }
      local_1e8[uVar10] = uVar15;
      uVar5 = uVar10;
    } while (uVar10 != uVar8);
  }
  lVar4 = local_1b8;
  printf("FormFullA: new_nnz = %lld\n",local_1b8);
  superlu_free(local_1f0);
  superlu_free(local_1c0);
  superlu_free(addr);
  superlu_free(__s);
  superlu_free(addr_02);
  superlu_free(addr_01);
  superlu_free(addr_00);
  *local_200 = pfVar7;
  *local_1f8 = piVar6;
  *colptr = local_1e8;
  *local_208 = (int_t)lVar4;
  fp = (FILE *)local_1b0;
LAB_00104d8a:
  fclose((FILE *)fp);
  return;
}

Assistant:

void
sreadhb(FILE *fp, int *nrow, int *ncol, int_t *nonz,
	float **nzval, int_t **rowind, int_t **colptr)
{

    register int i, numer_lines = 0, rhscrd = 0;
    int tmp, colnum, colsize, rownum, rowsize, valnum, valsize;
    char buf[100], type[4];
    int sym;

    /* Line 1 */
    fgets(buf, 100, fp);
    fputs(buf, stdout);

    /* Line 2 */
    for (i=0; i<5; i++) {
	fscanf(fp, "%14c", buf); buf[14] = 0;
	sscanf(buf, "%d", &tmp);
	if (i == 3) numer_lines = tmp;
	if (i == 4 && tmp) rhscrd = tmp;
    }
    sDumpLine(fp);

    /* Line 3 */
    fscanf(fp, "%3c", type);
    fscanf(fp, "%11c", buf); /* pad */
    type[3] = 0;
#if ( DEBUGlevel>=1 )
    printf("Matrix type %s\n", type);
#endif
    
    fscanf(fp, "%14c", buf); *nrow = atoi(buf);
    fscanf(fp, "%14c", buf); *ncol = atoi(buf);
    fscanf(fp, "%14c", buf); *nonz = atoi(buf);
    fscanf(fp, "%14c", buf); tmp = atoi(buf);
    
    if (tmp != 0)
	  printf("This is not an assembled matrix!\n");
    if (*nrow != *ncol)
	printf("Matrix is not square.\n");
    sDumpLine(fp);

    /* Allocate storage for the three arrays ( nzval, rowind, colptr ) */
    sallocateA(*ncol, *nonz, nzval, rowind, colptr);

    /* Line 4: format statement */
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &colnum, &colsize);
    fscanf(fp, "%16c", buf);
    sParseIntFormat(buf, &rownum, &rowsize);
    fscanf(fp, "%20c", buf);
    sParseFloatFormat(buf, &valnum, &valsize);
    fscanf(fp, "%20c", buf);
    sDumpLine(fp);

    /* Line 5: right-hand side */    
    if ( rhscrd ) sDumpLine(fp); /* skip RHSFMT */
    
#ifdef DEBUG
    printf("%d rows, %lld nonzeros\n", *nrow, (long long) *nonz);
    printf("colnum %d, colsize %d\n", colnum, colsize);
    printf("rownum %d, rowsize %d\n", rownum, rowsize);
    printf("valnum %d, valsize %d\n", valnum, valsize);
#endif
    
    ReadVector(fp, *ncol+1, *colptr, colnum, colsize);
    ReadVector(fp, *nonz, *rowind, rownum, rowsize);
    if ( numer_lines ) {
        sReadValues(fp, *nonz, *nzval, valnum, valsize);
    }
    
    sym = (type[1] == 'S' || type[1] == 's');
    if ( sym ) {
	FormFullA(*ncol, nonz, nzval, rowind, colptr);
    }

    fclose(fp);
}